

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

function<void_(const_QtPromisePrivate::PromiseError_&)> * __thiscall
QtPromisePrivate::PromiseCatcher<float,float(*)(QString_const&),QString_const&>::
create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
          (function<void_(const_QtPromisePrivate::PromiseError_&)> *__return_storage_ptr__,
          PromiseCatcher<float,float(*)(QString_const&),QString_const&> *this,
          _func_float_QString_ptr **handler,QPromiseResolve<float> *resolve,
          QPromiseReject<float> *reject)

{
  anon_class_24_3_a63a5800 local_40;
  QPromiseReject<float> *local_28;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  _func_float_QString_ptr **handler_local;
  
  local_28 = (QPromiseReject<float> *)resolve;
  reject_local = (QPromiseReject<float> *)handler;
  resolve_local = (QPromiseResolve<float> *)this;
  handler_local = (_func_float_QString_ptr **)__return_storage_ptr__;
  QtPromise::QPromiseResolve<float>::QPromiseResolve
            (&local_40.resolve,(QPromiseResolve<float> *)handler);
  QtPromise::QPromiseReject<float>::QPromiseReject(&local_40.reject,local_28);
  local_40.handler = (_func_float_QString_ptr *)(resolve_local->m_resolver).m_d.d;
  std::function<void(QtPromisePrivate::PromiseError_const&)>::
  function<QtPromisePrivate::PromiseCatcher<float,float(*)(QString_const&),QString_const&>::create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(float(*const&)(QString_const&),QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)::_lambda(QtPromisePrivate::PromiseError_const&)_1_,void>
            ((function<void(QtPromisePrivate::PromiseError_const&)> *)__return_storage_ptr__,
             &local_40);
  create<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>(float(*const&)(QString_const&),QtPromise::QPromiseResolve<float>const&,QtPromise::QPromiseReject<float>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const PromiseError&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const PromiseError& error) {
            try {
                error.rethrow();
            } catch (const TArg& argError) {
                PromiseDispatch<ResType>::call(resolve, reject, handler, argError);
            } catch (...) {
                reject(std::current_exception());
            }
        };
    }